

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

BPMNode * bpmnode_create(BPMLists *lists,int weight,uint index,BPMNode *tail)

{
  BPMNode **ppBVar1;
  BPMNode **ppBVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  BPMNode *pBVar5;
  uint uVar6;
  long lVar8;
  ulong uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  ulong uVar7;
  long lVar13;
  
  auVar3 = _DAT_001e4dd0;
  uVar6 = lists->nextfree;
  if (lists->numfree <= uVar6) {
    uVar4 = (ulong)lists->memsize;
    if (uVar4 != 0) {
      pBVar5 = lists->memory;
      lVar8 = uVar4 - 1;
      auVar10._8_4_ = (int)lVar8;
      auVar10._0_8_ = lVar8;
      auVar10._12_4_ = (int)((ulong)lVar8 >> 0x20);
      lVar8 = 0;
      auVar10 = auVar10 ^ _DAT_001e4dd0;
      auVar12 = _DAT_001e6180;
      auVar14 = _DAT_001e6120;
      do {
        auVar15 = auVar14 ^ auVar3;
        iVar11 = auVar10._4_4_;
        if ((bool)(~(auVar15._4_4_ == iVar11 && auVar10._0_4_ < auVar15._0_4_ ||
                    iVar11 < auVar15._4_4_) & 1)) {
          *(undefined4 *)((long)&pBVar5->in_use + lVar8) = 0;
        }
        if ((auVar15._12_4_ != auVar10._12_4_ || auVar15._8_4_ <= auVar10._8_4_) &&
            auVar15._12_4_ <= auVar10._12_4_) {
          *(undefined4 *)((long)&pBVar5[1].in_use + lVar8) = 0;
        }
        auVar15 = auVar12 ^ auVar3;
        iVar16 = auVar15._4_4_;
        if (iVar16 <= iVar11 && (iVar16 != iVar11 || auVar15._0_4_ <= auVar10._0_4_)) {
          *(undefined4 *)((long)&pBVar5[2].in_use + lVar8) = 0;
          *(undefined4 *)((long)&pBVar5[3].in_use + lVar8) = 0;
        }
        lVar13 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 4;
        auVar14._8_8_ = lVar13 + 4;
        lVar13 = auVar12._8_8_;
        auVar12._0_8_ = auVar12._0_8_ + 4;
        auVar12._8_8_ = lVar13 + 4;
        lVar8 = lVar8 + 0x60;
      } while ((uVar4 * 8 + 0x18 & 0xffffffffffffffe0) * 3 != lVar8);
    }
    uVar6 = lists->listsize;
    if ((ulong)uVar6 != 0) {
      ppBVar1 = lists->chains0;
      ppBVar2 = lists->chains1;
      uVar9 = 0;
      do {
        for (pBVar5 = ppBVar1[uVar9]; pBVar5 != (BPMNode *)0x0; pBVar5 = pBVar5->tail) {
          pBVar5->in_use = 1;
        }
        for (pBVar5 = ppBVar2[uVar9]; pBVar5 != (BPMNode *)0x0; pBVar5 = pBVar5->tail) {
          pBVar5->in_use = 1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar6);
    }
    lists->numfree = 0;
    if (uVar4 != 0) {
      lVar8 = 0;
      uVar9 = 0;
      do {
        uVar7 = uVar9;
        if (*(int *)((long)&lists->memory->in_use + lVar8) == 0) {
          uVar6 = (int)uVar9 + 1;
          uVar7 = (ulong)uVar6;
          lists->numfree = uVar6;
          lists->freelist[uVar9] = (BPMNode *)((long)&lists->memory->weight + lVar8);
        }
        lVar8 = lVar8 + 0x18;
        uVar9 = uVar7;
      } while (uVar4 * 0x18 != lVar8);
    }
    uVar6 = 0;
  }
  lists->nextfree = uVar6 + 1;
  pBVar5 = lists->freelist[uVar6];
  pBVar5->weight = weight;
  pBVar5->index = index;
  pBVar5->tail = tail;
  return pBVar5;
}

Assistant:

static BPMNode* bpmnode_create(BPMLists* lists, int weight, unsigned index, BPMNode* tail)
{
  unsigned i;
  BPMNode* result;

  /*memory full, so garbage collect*/
  if(lists->nextfree >= lists->numfree)
  {
    /*mark only those that are in use*/
    for(i = 0; i != lists->memsize; ++i) lists->memory[i].in_use = 0;
    for(i = 0; i != lists->listsize; ++i)
    {
      BPMNode* node;
      for(node = lists->chains0[i]; node != 0; node = node->tail) node->in_use = 1;
      for(node = lists->chains1[i]; node != 0; node = node->tail) node->in_use = 1;
    }
    /*collect those that are free*/
    lists->numfree = 0;
    for(i = 0; i != lists->memsize; ++i)
    {
      if(!lists->memory[i].in_use) lists->freelist[lists->numfree++] = &lists->memory[i];
    }
    lists->nextfree = 0;
  }

  result = lists->freelist[lists->nextfree++];
  result->weight = weight;
  result->index = index;
  result->tail = tail;
  return result;
}